

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void * mspace_malloc(mspace msp,size_t bytes)

{
  byte *pbVar1;
  undefined8 *puVar2;
  undefined1 (*pauVar3) [16];
  char *oldbase;
  long *plVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  undefined1 (*pauVar13) [16];
  void *pvVar14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  size_t dvs;
  undefined8 *puVar19;
  long *plVar20;
  undefined1 (*pauVar21) [16];
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  undefined8 *puVar28;
  ulong uVar29;
  undefined8 *puVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  
  if (bytes < 0xe9) {
    uVar17 = *msp;
    uVar29 = 0x20;
    if (0x16 < bytes) {
      uVar29 = (ulong)((int)bytes + 0x17U & 0x1f0);
    }
    uVar23 = (uint)(uVar29 >> 3);
    uVar22 = uVar17 >> (uVar23 & 0x1f);
    if ((uVar22 & 3) != 0) {
      uVar23 = (uVar22 & 1 | uVar23) ^ 1;
      uVar29 = (long)msp + (ulong)(uVar23 << 4) + 0x48;
      lVar15 = *(long *)(uVar29 + 0x10);
      uVar18 = *(ulong *)(lVar15 + 0x10);
      if (uVar29 == uVar18) {
        *(uint *)msp = uVar17 & ~(1 << (uVar23 & 0x1f));
      }
      else {
        if ((uVar18 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar18 + 0x18) != lVar15))
        goto LAB_00154832;
        *(ulong *)(uVar18 + 0x18) = uVar29;
        *(ulong *)(uVar29 + 0x10) = uVar18;
      }
      *(ulong *)(lVar15 + 8) = (ulong)(uVar23 << 3) + 3;
      pbVar1 = (byte *)(lVar15 + 8 + (ulong)(uVar23 << 3));
      *pbVar1 = *pbVar1 | 1;
      return (void *)(lVar15 + 0x10);
    }
    uVar18 = *(ulong *)((long)msp + 8);
    if (uVar18 < uVar29) {
      if (uVar22 != 0) {
        uVar10 = 2 << (uVar23 & 0x1f);
        uVar5 = 0;
        for (uVar23 = (-uVar10 | uVar10) & uVar22 << (uVar23 & 0x1f); (uVar23 & 1) == 0;
            uVar23 = uVar23 >> 1 | 0x80000000) {
          uVar5 = uVar5 + 1;
        }
        uVar24 = (long)msp + (ulong)(uVar5 << 4) + 0x48;
        lVar15 = *(long *)(uVar24 + 0x10);
        uVar27 = *(ulong *)(lVar15 + 0x10);
        if (uVar24 == uVar27) {
          uVar17 = uVar17 & ~(1 << (uVar5 & 0x1f));
          *(uint *)msp = uVar17;
        }
        else {
          if ((uVar27 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar27 + 0x18) != lVar15))
          goto LAB_00154832;
          *(ulong *)(uVar27 + 0x18) = uVar24;
          *(ulong *)(uVar24 + 0x10) = uVar27;
        }
        uVar27 = (ulong)(uVar5 << 3);
        uVar24 = uVar27 - uVar29;
        if (uVar24 < 0x20) {
          *(ulong *)(lVar15 + 8) = uVar27 | 3;
          pbVar1 = (byte *)(lVar15 + 8 + uVar27);
          *pbVar1 = *pbVar1 | 1;
          return (void *)(lVar15 + 0x10);
        }
        *(ulong *)(lVar15 + 8) = uVar29 | 3;
        *(ulong *)(lVar15 + 8 + uVar29) = uVar24 | 1;
        *(ulong *)(lVar15 + uVar27) = uVar24;
        if (uVar18 != 0) {
          lVar25 = *(long *)((long)msp + 0x20);
          uVar23 = (uint)(uVar18 >> 3);
          uVar18 = (long)msp + (ulong)(uVar23 * 2) * 8 + 0x48;
          if ((uVar17 >> (uVar23 & 0x1f) & 1) == 0) {
            *(uint *)msp = uVar17 | 1 << (uVar23 & 0x1f);
            uVar27 = uVar18;
          }
          else {
            uVar27 = *(ulong *)(uVar18 + 0x10);
            if (*(ulong *)(uVar18 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_00154832;
          }
          *(long *)(uVar18 + 0x10) = lVar25;
          *(long *)(uVar27 + 0x18) = lVar25;
          *(ulong *)(lVar25 + 0x10) = uVar27;
          *(ulong *)(lVar25 + 0x18) = uVar18;
        }
        *(ulong *)((long)msp + 8) = uVar24;
        *(ulong *)((long)msp + 0x20) = lVar15 + uVar29;
        return (void *)(lVar15 + 0x10);
      }
      uVar23 = *(uint *)((long)msp + 4);
      if (uVar23 != 0) {
        uVar22 = 0;
        for (uVar5 = uVar23; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
          uVar22 = uVar22 + 1;
        }
        puVar12 = *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600);
        uVar24 = (puVar12[1] & 0xfffffffffffffff8) - uVar29;
        puVar19 = puVar12;
        while ((puVar11 = (undefined8 *)puVar19[4], puVar11 != (undefined8 *)0x0 ||
               (puVar11 = (undefined8 *)puVar19[5], puVar11 != (undefined8 *)0x0))) {
          uVar27 = (puVar11[1] & 0xfffffffffffffff8) - uVar29;
          puVar19 = puVar11;
          if (uVar27 < uVar24) {
            puVar12 = puVar11;
            uVar24 = uVar27;
          }
        }
        puVar19 = *(undefined8 **)((long)msp + 0x18);
        if (puVar12 < puVar19) goto LAB_00154832;
        puVar11 = (undefined8 *)puVar12[3];
        uVar27 = puVar12[6];
        if (puVar11 == puVar12) {
          if ((undefined8 *)puVar12[5] == (undefined8 *)0x0) {
            if ((undefined8 *)puVar12[4] == (undefined8 *)0x0) {
              puVar11 = (undefined8 *)0x0;
              goto LAB_001546f1;
            }
            puVar2 = (undefined8 *)puVar12[4];
            puVar30 = puVar12 + 4;
          }
          else {
            puVar2 = (undefined8 *)puVar12[5];
            puVar30 = puVar12 + 5;
          }
          do {
            do {
              puVar28 = puVar30;
              puVar11 = puVar2;
              puVar2 = (undefined8 *)puVar11[5];
              puVar30 = puVar11 + 5;
            } while ((undefined8 *)puVar11[5] != (undefined8 *)0x0);
            puVar2 = (undefined8 *)puVar11[4];
            puVar30 = puVar11 + 4;
          } while ((undefined8 *)puVar11[4] != (undefined8 *)0x0);
          if (puVar28 < puVar19) goto LAB_00154832;
          *puVar28 = 0;
        }
        else {
          puVar2 = (undefined8 *)puVar12[2];
          if (((puVar2 < puVar19) || ((undefined8 *)puVar2[3] != puVar12)) ||
             ((undefined8 *)puVar11[2] != puVar12)) goto LAB_00154832;
          puVar2[3] = puVar11;
          puVar11[2] = puVar2;
        }
LAB_001546f1:
        if (uVar27 != 0) {
          uVar22 = *(uint *)(puVar12 + 7);
          if (puVar12 == *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600)) {
            *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600) = puVar11;
            if (puVar11 == (undefined8 *)0x0) {
              *(uint *)((long)msp + 4) = uVar23 & ~(1 << (uVar22 & 0x1f));
            }
            else {
LAB_0015473c:
              puVar19 = *(undefined8 **)((long)msp + 0x18);
              if (puVar11 < puVar19) goto LAB_00154832;
              puVar11[6] = uVar27;
              puVar2 = (undefined8 *)puVar12[4];
              if (puVar2 != (undefined8 *)0x0) {
                if (puVar2 < puVar19) goto LAB_00154832;
                puVar11[4] = puVar2;
                puVar2[6] = puVar11;
              }
              uVar27 = puVar12[5];
              if (uVar27 != 0) {
                if (uVar27 < *(ulong *)((long)msp + 0x18)) goto LAB_00154832;
                puVar11[5] = uVar27;
                *(undefined8 **)(uVar27 + 0x30) = puVar11;
              }
            }
          }
          else {
            if (uVar27 < *(ulong *)((long)msp + 0x18)) goto LAB_00154832;
            *(undefined8 **)
             (uVar27 + 0x20 + (ulong)(*(undefined8 **)(uVar27 + 0x20) != puVar12) * 8) = puVar11;
            if (puVar11 != (undefined8 *)0x0) goto LAB_0015473c;
          }
        }
        if (uVar24 < 0x20) {
          puVar12[1] = uVar24 + uVar29 | 3;
          pbVar1 = (byte *)((long)puVar12 + uVar24 + uVar29 + 8);
          *pbVar1 = *pbVar1 | 1;
        }
        else {
          puVar12[1] = uVar29 | 3;
          *(ulong *)((long)puVar12 + uVar29 + 8) = uVar24 | 1;
          *(ulong *)((long)puVar12 + uVar29 + uVar24) = uVar24;
          if (uVar18 != 0) {
            lVar15 = *(long *)((long)msp + 0x20);
            uVar23 = (uint)(uVar18 >> 3);
            uVar18 = (long)msp + (ulong)(uVar23 * 2) * 8 + 0x48;
            if ((uVar17 >> (uVar23 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << (uVar23 & 0x1f) | uVar17;
              uVar27 = uVar18;
            }
            else {
              uVar27 = *(ulong *)(uVar18 + 0x10);
              if (*(ulong *)(uVar18 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_00154832;
            }
            *(long *)(uVar18 + 0x10) = lVar15;
            *(long *)(uVar27 + 0x18) = lVar15;
            *(ulong *)(lVar15 + 0x10) = uVar27;
            *(ulong *)(lVar15 + 0x18) = uVar18;
          }
          *(ulong *)((long)msp + 8) = uVar24;
          *(ulong *)((long)msp + 0x20) = (long)puVar12 + uVar29;
        }
        goto LAB_00153e81;
      }
    }
  }
  else {
    uVar29 = 0xffffffffffffffff;
    if (bytes < 0xffffffffffffff80) {
      uVar17 = *(uint *)((long)msp + 4);
      uVar29 = bytes + 0x17 & 0xfffffffffffffff0;
      if (uVar17 != 0) {
        uVar23 = (uint)(bytes + 0x17 >> 8);
        if (uVar23 == 0) {
          uVar22 = 0;
        }
        else {
          uVar22 = 0x1f;
          if (uVar23 < 0x10000) {
            uVar22 = ((uint)(uVar29 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar23)) & 0x3f)) & 1) +
                     LZCOUNT(uVar23) * 2 ^ 0x3e;
          }
        }
        puVar12 = *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600);
        uVar18 = -uVar29;
        if (puVar12 == (undefined8 *)0x0) {
          puVar19 = (undefined8 *)0x0;
          puVar11 = (undefined8 *)0x0;
        }
        else {
          uVar24 = (ulong)(byte)(0x39 - (char)(uVar22 >> 1));
          if (uVar22 == 0x1f) {
            uVar24 = 0;
          }
          puVar11 = (undefined8 *)0x0;
          lVar15 = uVar29 << (uVar24 & 0x3f);
          puVar19 = (undefined8 *)0x0;
          do {
            uVar24 = (puVar12[1] & 0xfffffffffffffff8) - uVar29;
            if ((uVar24 < uVar18) && (puVar11 = puVar12, uVar18 = uVar24, uVar24 == 0)) {
              uVar18 = 0;
              goto LAB_00153ce5;
            }
            puVar2 = (undefined8 *)puVar12[5];
            puVar12 = (undefined8 *)puVar12[4 - (lVar15 >> 0x3f)];
            puVar30 = puVar2;
            if (puVar2 == puVar12) {
              puVar30 = puVar19;
            }
            if (puVar2 != (undefined8 *)0x0) {
              puVar19 = puVar30;
            }
            lVar15 = lVar15 * 2;
          } while (puVar12 != (undefined8 *)0x0);
        }
        puVar12 = puVar11;
        if (puVar19 == (undefined8 *)0x0 && puVar11 == (undefined8 *)0x0) {
          uVar23 = 2 << (uVar22 & 0x1f);
          uVar23 = (-uVar23 | uVar23) & uVar17;
          if (uVar23 == 0) goto LAB_00153d79;
          uVar22 = 0;
          for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
            uVar22 = uVar22 + 1;
          }
          puVar19 = *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600);
          puVar12 = (undefined8 *)0x0;
        }
        while (puVar11 = puVar19, puVar19 != (undefined8 *)0x0) {
LAB_00153ce5:
          puVar19 = (undefined8 *)puVar11[4];
          uVar24 = (puVar11[1] & 0xfffffffffffffff8) - uVar29;
          if (uVar24 < uVar18) {
            puVar12 = puVar11;
            uVar18 = uVar24;
          }
          if (puVar19 == (undefined8 *)0x0) {
            puVar19 = (undefined8 *)puVar11[5];
          }
        }
        if ((puVar12 != (undefined8 *)0x0) && (uVar18 < *(long *)((long)msp + 8) - uVar29)) {
          puVar19 = *(undefined8 **)((long)msp + 0x18);
          if ((puVar12 < puVar19) || ((long)uVar29 < 1)) goto LAB_00154832;
          puVar11 = (undefined8 *)puVar12[3];
          uVar24 = puVar12[6];
          if (puVar11 == puVar12) {
            if ((undefined8 *)puVar12[5] == (undefined8 *)0x0) {
              if ((undefined8 *)puVar12[4] == (undefined8 *)0x0) {
                puVar11 = (undefined8 *)0x0;
                goto LAB_00154486;
              }
              puVar2 = (undefined8 *)puVar12[4];
              puVar30 = puVar12 + 4;
            }
            else {
              puVar2 = (undefined8 *)puVar12[5];
              puVar30 = puVar12 + 5;
            }
            do {
              do {
                puVar28 = puVar30;
                puVar11 = puVar2;
                puVar2 = (undefined8 *)puVar11[5];
                puVar30 = puVar11 + 5;
              } while ((undefined8 *)puVar11[5] != (undefined8 *)0x0);
              puVar2 = (undefined8 *)puVar11[4];
              puVar30 = puVar11 + 4;
            } while ((undefined8 *)puVar11[4] != (undefined8 *)0x0);
            if (puVar28 < puVar19) goto LAB_00154832;
            *puVar28 = 0;
          }
          else {
            puVar2 = (undefined8 *)puVar12[2];
            if (((puVar2 < puVar19) || ((undefined8 *)puVar2[3] != puVar12)) ||
               ((undefined8 *)puVar11[2] != puVar12)) goto LAB_00154832;
            puVar2[3] = puVar11;
            puVar11[2] = puVar2;
          }
LAB_00154486:
          if (uVar24 != 0) {
            uVar23 = *(uint *)(puVar12 + 7);
            if (puVar12 == *(undefined8 **)((long)msp + (ulong)uVar23 * 8 + 600)) {
              *(undefined8 **)((long)msp + (ulong)uVar23 * 8 + 600) = puVar11;
              if (puVar11 == (undefined8 *)0x0) {
                *(uint *)((long)msp + 4) = uVar17 & ~(1 << (uVar23 & 0x1f));
              }
              else {
LAB_001544c2:
                puVar19 = *(undefined8 **)((long)msp + 0x18);
                if (puVar11 < puVar19) goto LAB_00154832;
                puVar11[6] = uVar24;
                puVar2 = (undefined8 *)puVar12[4];
                if (puVar2 != (undefined8 *)0x0) {
                  if (puVar2 < puVar19) goto LAB_00154832;
                  puVar11[4] = puVar2;
                  puVar2[6] = puVar11;
                }
                uVar24 = puVar12[5];
                if (uVar24 != 0) {
                  if (uVar24 < *(ulong *)((long)msp + 0x18)) goto LAB_00154832;
                  puVar11[5] = uVar24;
                  *(undefined8 **)(uVar24 + 0x30) = puVar11;
                }
              }
            }
            else {
              if (uVar24 < *(ulong *)((long)msp + 0x18)) goto LAB_00154832;
              *(undefined8 **)
               (uVar24 + 0x20 + (ulong)(*(undefined8 **)(uVar24 + 0x20) != puVar12) * 8) = puVar11;
              if (puVar11 != (undefined8 *)0x0) goto LAB_001544c2;
            }
          }
          if (uVar18 < 0x20) {
            puVar12[1] = uVar18 + uVar29 | 3;
            pbVar1 = (byte *)((long)puVar12 + uVar18 + uVar29 + 8);
            *pbVar1 = *pbVar1 | 1;
          }
          else {
            lVar15 = (long)puVar12 + uVar29;
            puVar12[1] = uVar29 | 3;
            *(ulong *)((long)puVar12 + uVar29 + 8) = uVar18 | 1;
            *(ulong *)(lVar15 + uVar18) = uVar18;
            if (0xff < uVar18) {
              uVar17 = (uint)(uVar18 >> 8);
              if (uVar17 == 0) {
                uVar23 = 0;
              }
              else {
                uVar23 = 0x1f;
                if (uVar17 < 0x10000) {
                  uVar23 = ((uint)(uVar18 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar17)) & 0x3f)) &
                           1) + LZCOUNT(uVar17) * 2 ^ 0x3e;
                }
              }
              *(uint *)(lVar15 + 0x38) = uVar23;
              plVar20 = (long *)((long)msp + (ulong)uVar23 * 8 + 600);
              *(undefined1 (*) [16])(lVar15 + 0x20) = (undefined1  [16])0x0;
              if ((*(uint *)((long)msp + 4) >> (uVar23 & 0x1f) & 1) == 0) {
                *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar23 & 0x1f);
                *plVar20 = lVar15;
              }
              else {
                uVar29 = (ulong)(byte)(0x39 - (char)(uVar23 >> 1));
                if (uVar23 == 0x1f) {
                  uVar29 = 0;
                }
                lVar25 = uVar18 << (uVar29 & 0x3f);
                plVar4 = (long *)*plVar20;
                do {
                  plVar20 = plVar4;
                  if ((plVar20[1] & 0xfffffffffffffff8U) == uVar18) {
                    if ((plVar20 < *(long **)((long)msp + 0x18)) ||
                       (plVar4 = (long *)plVar20[2], plVar4 < *(long **)((long)msp + 0x18)))
                    goto LAB_00154832;
                    plVar4[3] = lVar15;
                    plVar20[2] = lVar15;
                    *(long **)(lVar15 + 0x10) = plVar4;
                    *(long **)(lVar15 + 0x18) = plVar20;
                    *(undefined8 *)(lVar15 + 0x30) = 0;
                    goto LAB_00153e81;
                  }
                  lVar6 = lVar25 >> 0x3f;
                  lVar25 = lVar25 * 2;
                  plVar4 = (long *)plVar20[4 - lVar6];
                } while ((long *)plVar20[4 - lVar6] != (long *)0x0);
                if (plVar20 + (4 - lVar6) < *(long **)((long)msp + 0x18)) goto LAB_00154832;
                plVar20[4 - lVar6] = lVar15;
              }
              *(long **)(lVar15 + 0x30) = plVar20;
              *(long *)(lVar15 + 0x18) = lVar15;
              *(long *)(lVar15 + 0x10) = lVar15;
              goto LAB_00153e81;
            }
            uVar29 = (long)msp + (uVar18 >> 3) * 0x10 + 0x48;
            uVar17 = (uint)(uVar18 >> 3);
            if ((*msp >> (uVar17 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << (uVar17 & 0x1f);
              uVar18 = uVar29;
            }
            else {
              uVar18 = *(ulong *)(uVar29 + 0x10);
              if (*(ulong *)(uVar29 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_00154832;
            }
            *(long *)(uVar29 + 0x10) = lVar15;
            *(long *)(uVar18 + 0x18) = lVar15;
            *(ulong *)(lVar15 + 0x10) = uVar18;
            *(ulong *)(lVar15 + 0x18) = uVar29;
          }
          goto LAB_00153e81;
        }
      }
    }
  }
LAB_00153d79:
  uVar18 = *(ulong *)((long)msp + 8);
  uVar24 = uVar18 - uVar29;
  if (uVar29 <= uVar18) {
    puVar12 = *(undefined8 **)((long)msp + 0x20);
    if (uVar24 < 0x20) {
      lVar15 = 0;
      puVar12[1] = uVar18 | 3;
      pbVar1 = (byte *)((long)puVar12 + uVar18 + 8);
      *pbVar1 = *pbVar1 | 1;
      uVar24 = 0;
    }
    else {
      lVar15 = (long)puVar12 + uVar29;
      *(ulong *)((long)puVar12 + uVar29 + 8) = uVar24 | 1;
      *(ulong *)((long)puVar12 + uVar18) = uVar24;
      puVar12[1] = uVar29 | 3;
    }
    *(long *)((long)msp + 0x20) = lVar15;
    *(ulong *)((long)msp + 8) = uVar24;
    goto LAB_00153e81;
  }
  uVar18 = *(ulong *)((long)msp + 0x10) - uVar29;
  if (*(ulong *)((long)msp + 0x10) < uVar29 || uVar18 == 0) {
    if (mparams.magic == 0) {
      init_mparams();
    }
    if ((((*(byte *)((long)msp + 0x370) & 1) != 0) && (mparams.mmap_threshold <= uVar29)) &&
       (*(long *)((long)msp + 0x10) != 0)) {
      uVar18 = -mparams.page_size & uVar29 + 0x3e + mparams.page_size;
      if (*(ulong *)((long)msp + 0x368) == 0) {
        if (uVar29 < uVar18) goto LAB_00153f68;
      }
      else {
        uVar24 = *(ulong *)((long)msp + 0x358) + uVar18;
        if ((uVar29 < uVar18 && *(ulong *)((long)msp + 0x358) < uVar24) &&
            uVar24 <= *(ulong *)((long)msp + 0x368)) {
LAB_00153f68:
          pvVar14 = mmap((void *)0x0,uVar18,3,0x22,-1,0);
          if (pvVar14 != (void *)0xffffffffffffffff) {
            uVar29 = (ulong)(-(int)pvVar14 - 0x10U & 0xf);
            puVar12 = (undefined8 *)((long)pvVar14 + uVar29);
            *(ulong *)((long)pvVar14 + uVar29) = uVar29;
            *(ulong *)((long)pvVar14 + uVar29 + 8) = (uVar18 - uVar29) + -0x20;
            *(undefined8 *)((uVar18 - uVar29) + -0x18 + (long)puVar12) = 0xb;
            *(undefined8 *)((long)pvVar14 + (uVar18 - 0x10)) = 0;
            if ((*(void **)((long)msp + 0x18) == (void *)0x0) ||
               (pvVar14 < *(void **)((long)msp + 0x18))) {
              *(void **)((long)msp + 0x18) = pvVar14;
            }
            uVar18 = uVar18 + *(long *)((long)msp + 0x358);
            *(ulong *)((long)msp + 0x358) = uVar18;
            if (*(ulong *)((long)msp + 0x360) < uVar18) {
              *(ulong *)((long)msp + 0x360) = uVar18;
            }
            goto LAB_00153e81;
          }
        }
      }
    }
    uVar18 = -mparams.granularity & uVar29 + 0x5f + mparams.granularity;
    if (uVar18 <= uVar29) {
      return (void *)0x0;
    }
    if ((*(ulong *)((long)msp + 0x368) != 0) &&
       (uVar24 = *(ulong *)((long)msp + 0x358) + uVar18,
       *(ulong *)((long)msp + 0x368) < uVar24 || uVar24 <= *(ulong *)((long)msp + 0x358))) {
      return (void *)0x0;
    }
    pauVar13 = (undefined1 (*) [16])mmap((void *)0x0,uVar18,3,0x22,-1,0);
    if (pauVar13 == (undefined1 (*) [16])0xffffffffffffffff) {
LAB_00154984:
      piVar16 = __errno_location();
      *piVar16 = 0xc;
      return (void *)0x0;
    }
    uVar24 = *(long *)((long)msp + 0x358) + uVar18;
    *(ulong *)((long)msp + 0x358) = uVar24;
    if (*(ulong *)((long)msp + 0x360) < uVar24) {
      *(ulong *)((long)msp + 0x360) = uVar24;
    }
    pauVar3 = *(undefined1 (**) [16])((long)msp + 0x28);
    if (pauVar3 == (undefined1 (*) [16])0x0) {
      if ((*(undefined1 (**) [16])((long)msp + 0x18) == (undefined1 (*) [16])0x0) ||
         (pauVar13 < *(undefined1 (**) [16])((long)msp + 0x18))) {
        *(undefined1 (**) [16])((long)msp + 0x18) = pauVar13;
      }
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x303020201010000));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x707060605050404));
      auVar38 = vpbroadcastq_avx512f(ZEXT816(8));
      *(undefined1 (**) [16])((long)msp + 0x378) = pauVar13;
      *(ulong *)((long)msp + 0x380) = uVar18;
      *(undefined4 *)((long)msp + 0x390) = 1;
      auVar31 = vpbroadcastq_avx512f();
      *(size_t *)((long)msp + 0x40) = mparams.magic;
      lVar15 = 0x20;
      *(undefined8 *)((long)msp + 0x38) = 0xfff;
      do {
        auVar32 = vpsllq_avx512f(auVar35,4);
        auVar35 = vpaddq_avx512f(auVar35,auVar38);
        lVar15 = lVar15 + -8;
        auVar33 = vpaddq_avx512f(auVar31,auVar32);
        auVar34 = vpermq_avx512f(auVar36,auVar33);
        auVar32 = vpermq_avx512f(auVar37,auVar33);
        auVar32 = vmovdqu64_avx512f(auVar32);
        *(undefined1 (*) [64])(auVar33._0_8_ + 0x50) = auVar32;
        auVar32 = vmovdqu64_avx512f(auVar34);
        *(undefined1 (*) [64])(auVar33._0_8_ + 0x10) = auVar32;
      } while (lVar15 != 0);
      uVar24 = *(ulong *)((long)msp + -8) & 0xfffffffffffffff8;
      lVar15 = (long)msp + (uVar24 - 0x10);
      uVar27 = (ulong)(-(int)lVar15 - 0x10U & 0xf);
      lVar25 = (long)msp + (uVar27 - 0x10) + uVar24;
      uVar24 = (long)pauVar13 + ((uVar18 - lVar15) - uVar27) + -0x50;
      *(long *)((long)msp + 0x28) = lVar25;
      *(ulong *)((long)msp + 0x10) = uVar24;
      *(ulong *)(lVar25 + 8) = uVar24 | 1;
      *(undefined8 *)(pauVar13[-5] + uVar18 + 8) = 0x50;
LAB_00154233:
      *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
    }
    else {
      puVar12 = (undefined8 *)((long)msp + 0x378);
      puVar19 = puVar12;
      do {
        if (pauVar13 == (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar19 + puVar19[1])) {
          if ((((pauVar3 < pauVar13) && ((undefined1 (*) [16])*puVar19 <= pauVar3)) &&
              ((*(uint *)(puVar19 + 3) & 8) == 0)) && ((*(uint *)(puVar19 + 3) & 1) != 0)) {
            puVar19[1] = puVar19[1] + uVar18;
            lVar15 = uVar18 + *(long *)((long)msp + 0x10);
            uVar18 = (ulong)(-(int)pauVar3 - 0x10U & 0xf);
            *(undefined1 **)((long)msp + 0x28) = *pauVar3 + uVar18;
            uVar24 = lVar15 - uVar18;
            *(ulong *)((long)msp + 0x10) = uVar24;
            *(ulong *)(*pauVar3 + uVar18 + 8) = uVar24 | 1;
            *(undefined8 *)(*pauVar3 + lVar15 + 8) = 0x50;
            goto LAB_00154233;
          }
          break;
        }
        puVar19 = (undefined8 *)puVar19[2];
      } while (puVar19 != (undefined8 *)0x0);
      if (pauVar13 < *(undefined1 (**) [16])((long)msp + 0x18)) {
        *(undefined1 (**) [16])((long)msp + 0x18) = pauVar13;
      }
      puVar19 = puVar12;
      do {
        oldbase = (char *)*puVar19;
        puVar11 = puVar12;
        if (oldbase == *pauVar13 + uVar18) {
          if (((*(uint *)(puVar19 + 3) & 8) == 0 & (byte)*(uint *)(puVar19 + 3)) != 0) {
            *puVar19 = pauVar13;
            puVar19[1] = puVar19[1] + uVar18;
            pvVar14 = prepend_alloc((mstate)msp,(char *)pauVar13,oldbase,uVar29);
            return pvVar14;
          }
          break;
        }
        puVar19 = (undefined8 *)puVar19[2];
      } while (puVar19 != (undefined8 *)0x0);
      for (; (pauVar3 < (undefined1 (*) [16])*puVar11 ||
             (pauVar21 = (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar11 + puVar11[1]),
             pauVar21 <= pauVar3)); puVar11 = (undefined8 *)puVar11[2]) {
      }
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar36 = vpbroadcastq_avx512f(ZEXT816(0xb));
      pauVar26 = (undefined1 (*) [16])(pauVar21[-6] + (ulong)(0x4fU - (int)pauVar21 & 0xf) + 1);
      if ((undefined1 (*) [16])(pauVar21[-6] + (ulong)(0x4fU - (int)pauVar21 & 0xf) + 1) <
          pauVar3 + 2) {
        pauVar26 = pauVar3;
      }
      uVar27 = (ulong)(-(int)pauVar13 - 0x10U & 0xf);
      uVar24 = (uVar18 - 0x50) - uVar27;
      *(undefined1 **)((long)msp + 0x28) = *pauVar13 + uVar27;
      *(ulong *)((long)msp + 0x10) = uVar24;
      *(ulong *)(*pauVar13 + uVar27 + 8) = uVar24 | 1;
      *(undefined8 *)(pauVar13[-5] + uVar18 + 8) = 0x50;
      *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
      *(undefined8 *)(*pauVar26 + 8) = 0x33;
      uVar7 = *(undefined8 *)((long)msp + 0x380);
      uVar8 = *(undefined8 *)((long)msp + 0x388);
      uVar9 = *(undefined8 *)((long)msp + 0x390);
      *(undefined8 *)pauVar26[1] = *puVar12;
      *(undefined8 *)(pauVar26[1] + 8) = uVar7;
      *(undefined8 *)pauVar26[2] = uVar8;
      *(undefined8 *)(pauVar26[2] + 8) = uVar9;
      *(undefined1 (**) [16])((long)msp + 0x378) = pauVar13;
      *(ulong *)((long)msp + 0x380) = uVar18;
      *(uint *)((long)msp + 0x390) = (uint)(pauVar13 != (undefined1 (*) [16])0xffffffffffffffff);
      *(undefined1 (**) [16])((long)msp + 0x388) = pauVar26 + 1;
      pauVar13 = pauVar26 + 4;
      if (pauVar26 + 4 < pauVar21) {
        pauVar13 = pauVar21;
      }
      uVar18 = 0;
      auVar37 = vpbroadcastq_avx512f();
      auVar37 = vpsrlq_avx512f(auVar37,3);
      do {
        auVar38 = vpbroadcastq_avx512f();
        auVar38 = vporq_avx512f(auVar38,auVar35);
        vpcmpuq_avx512f(auVar38,auVar37,2);
        auVar38 = vmovdqu64_avx512f(auVar36);
        *(undefined1 (*) [64])(pauVar26[3] + uVar18 * 8 + 8) = auVar38;
        uVar18 = uVar18 + 8;
      } while ((((ulong)((long)pauVar13 + (-0x39 - (long)pauVar26)) >> 3) + 8 & 0xfffffffffffffff8)
               != uVar18);
      uVar18 = (long)pauVar26 - (long)pauVar3;
      if (uVar18 != 0) {
        (*pauVar26)[8] = (*pauVar26)[8] & 0xfe;
        *(ulong *)(*pauVar3 + 8) = uVar18 | 1;
        *(ulong *)*pauVar26 = uVar18;
        if (uVar18 < 0x100) {
          pauVar13 = (undefined1 (*) [16])((long)msp + (uVar18 >> 3) * 0x10 + 0x48);
          uVar17 = (uint)(uVar18 >> 3);
          if ((*msp >> (uVar17 & 0x1f) & 1) == 0) {
            *(uint *)msp = *msp | 1 << (uVar17 & 0x1f);
            pauVar21 = pauVar13;
          }
          else {
            pauVar21 = *(undefined1 (**) [16])pauVar13[1];
            if (*(undefined1 (**) [16])pauVar13[1] < *(undefined1 (**) [16])((long)msp + 0x18)) {
LAB_00154832:
              abort();
            }
          }
          *(undefined1 (**) [16])pauVar13[1] = pauVar3;
          *(undefined1 (**) [16])(pauVar21[1] + 8) = pauVar3;
          lVar15 = 0x18;
          lVar25 = 0x10;
        }
        else {
          uVar17 = (uint)(uVar18 >> 8);
          if (uVar17 == 0) {
            uVar23 = 0;
          }
          else {
            uVar23 = 0x1f;
            if (uVar17 < 0x10000) {
              uVar23 = ((uint)(uVar18 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar17)) & 0x3f)) & 1)
                       + LZCOUNT(uVar17) * 2 ^ 0x3e;
            }
          }
          *(uint *)(pauVar3[3] + 8) = uVar23;
          puVar12 = (undefined8 *)((long)msp + (ulong)uVar23 * 8 + 600);
          pauVar3[2] = (undefined1  [16])0x0;
          if ((*(uint *)((long)msp + 4) >> (uVar23 & 0x1f) & 1) == 0) {
            *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar23 & 0x1f);
            *puVar12 = pauVar3;
            *(undefined8 **)pauVar3[3] = puVar12;
          }
          else {
            uVar24 = (ulong)(byte)(0x39 - (char)(uVar23 >> 1));
            if (uVar23 == 0x1f) {
              uVar24 = 0;
            }
            lVar15 = uVar18 << (uVar24 & 0x3f);
            pauVar13 = (undefined1 (*) [16])*puVar12;
            do {
              pauVar21 = pauVar13;
              if ((*(ulong *)(*pauVar21 + 8) & 0xfffffffffffffff8) == uVar18) {
                if ((pauVar21 < *(undefined1 (**) [16])((long)msp + 0x18)) ||
                   (pauVar13 = *(undefined1 (**) [16])pauVar21[1],
                   pauVar13 < *(undefined1 (**) [16])((long)msp + 0x18))) goto LAB_00154832;
                *(undefined1 (**) [16])(pauVar13[1] + 8) = pauVar3;
                *(undefined1 (**) [16])pauVar21[1] = pauVar3;
                *(undefined1 (**) [16])pauVar3[1] = pauVar13;
                lVar15 = 0x30;
                lVar25 = 0x18;
                pauVar13 = (undefined1 (*) [16])0x0;
                goto LAB_0015496f;
              }
              lVar25 = lVar15 >> 0x3f;
              lVar15 = lVar15 * 2;
              pauVar13 = *(undefined1 (**) [16])((long)pauVar21 + lVar25 * -8 + 0x20);
            } while (pauVar13 != (undefined1 (*) [16])0x0);
            puVar12 = (undefined8 *)((long)pauVar21 + lVar25 * -8 + 0x20);
            if (puVar12 < *(undefined8 **)((long)msp + 0x18)) goto LAB_00154832;
            *puVar12 = pauVar3;
            *(undefined1 (**) [16])pauVar3[3] = pauVar21;
          }
          lVar15 = 0x10;
          lVar25 = 0x18;
          pauVar21 = pauVar3;
          pauVar13 = pauVar3;
        }
LAB_0015496f:
        *(undefined1 (**) [16])(*pauVar3 + lVar25) = pauVar21;
        *(undefined1 (**) [16])(*pauVar3 + lVar15) = pauVar13;
      }
    }
    uVar18 = *(ulong *)((long)msp + 0x10) - uVar29;
    if (*(ulong *)((long)msp + 0x10) < uVar29 || uVar18 == 0) goto LAB_00154984;
  }
  *(ulong *)((long)msp + 0x10) = uVar18;
  puVar12 = *(undefined8 **)((long)msp + 0x28);
  *(ulong *)((long)msp + 0x28) = (long)puVar12 + uVar29;
  *(ulong *)((long)puVar12 + uVar29 + 8) = uVar18 | 1;
  puVar12[1] = uVar29 | 3;
LAB_00153e81:
  return puVar12 + 2;
}

Assistant:

void* mspace_malloc(mspace msp, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (!PREACTION(ms)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = ms->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(ms, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(ms, b, p, idx);
        set_inuse_and_pinuse(ms, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }

      else if (nb > ms->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(ms, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(ms, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(ms, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(ms, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }

        else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }
    }

    if (nb <= ms->dvsize) {
      size_t rsize = ms->dvsize - nb;
      mchunkptr p = ms->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
        ms->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = ms->dvsize;
        ms->dvsize = 0;
        ms->dv = 0;
        set_inuse_and_pinuse(ms, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    else if (nb < ms->topsize) { /* Split top */
      size_t rsize = ms->topsize -= nb;
      mchunkptr p = ms->top;
      mchunkptr r = ms->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(ms, ms->top);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(ms, nb);

  postaction:
    POSTACTION(ms);
    return mem;
  }

  return 0;
}